

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O3

void __thiscall VcdGen::VcdGenerator::generate_tick_data(VcdGenerator *this)

{
  pointer *pptVar1;
  string *psVar2;
  uint __val;
  Signal *pSVar3;
  pointer pcVar4;
  long lVar5;
  pointer ptVar6;
  char cVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  uint uVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  char cVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  undefined1 auVar16 [8];
  bool bVar17;
  undefined1 local_b8 [8];
  Type data;
  string __str;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  ulong local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  get_tick_data();
  std::
  vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
            *)local_b8,&get_tick_data::tick_data.tick_data_);
  ptVar6 = data.
           super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar16 = local_b8;
  if (local_b8 !=
      (undefined1  [8])
      data.
      super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = ((long)data.
                    super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start - (long)local_b8 >> 3) *
             -0x5555555555555555;
    lVar5 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>*,std::vector<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>,std::allocator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b8,data.
                        super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>*,std::vector<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>,std::allocator<std::tuple<unsigned_long,unsigned_int,VcdGen::Signal_const*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar16,ptVar6);
    if (local_b8 !=
        (undefined1  [8])
        data.
        super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      psVar2 = &this->vcd_data_;
      __str.field_2._8_8_ = 0xffffffffffffffff;
      auVar16 = local_b8;
      do {
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(((pointer)auVar16)->
                     super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
                     super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        __val = (((pointer)auVar16)->
                super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
                super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
                super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
        pSVar3 = (((pointer)auVar16)->
                 super__Tuple_impl<0UL,_unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>).
                 super__Tuple_impl<1UL,_unsigned_int,_const_VcdGen::Signal_*>.
                 super__Tuple_impl<2UL,_const_VcdGen::Signal_*>.
                 super__Head_base<2UL,_const_VcdGen::Signal_*,_false>._M_head_impl;
        uVar10 = pSVar3->width_;
        bVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)__str.field_2._8_8_ != paVar12;
        __str.field_2._8_8_ = paVar12;
        if (bVar17) {
          cVar13 = '\x01';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x9 < paVar12) {
            cVar7 = '\x04';
            do {
              cVar13 = cVar7;
              if (paVar12 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x64) {
                cVar13 = cVar13 + -2;
                goto LAB_00103d7f;
              }
              if (paVar12 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x3e8) {
                cVar13 = cVar13 + -1;
                goto LAB_00103d7f;
              }
              if (paVar12 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x2710) goto LAB_00103d7f;
              bVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x1869f < paVar12;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ulong)paVar12 / 10000);
              cVar7 = cVar13 + '\x04';
            } while (bVar17);
            cVar13 = cVar13 + '\x01';
          }
LAB_00103d7f:
          data.
          super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__str._M_string_length;
          pptVar1 = &data.
                     super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::_M_construct((ulong)pptVar1,cVar13);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)data.
                             super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (uint)__str._M_dataplus._M_p,__str.field_2._8_8_);
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)pptVar1,0,(char *)0x0,0x1061e0);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          puVar9 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_70.field_2._M_allocated_capacity = *puVar9;
            local_70.field_2._8_8_ = puVar8[3];
          }
          else {
            local_70.field_2._M_allocated_capacity = *puVar9;
            local_70._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_70._M_string_length = puVar8[1];
          *puVar8 = puVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar9 = (ulong *)std::__cxx11::string::append((char *)&local_70);
          local_50 = &local_40;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar12) {
            local_40._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_40._8_8_ = puVar9[3];
          }
          else {
            local_40._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar9;
          }
          local_48 = puVar9[1];
          *puVar9 = (ulong)paVar12;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (data.
              super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&__str._M_string_length
             ) {
            operator_delete(data.
                            super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            __str._M_string_length + 1);
          }
        }
        if (uVar10 < 2) {
          cVar13 = '\x01';
          if (9 < __val) {
            uVar10 = __val;
            cVar7 = '\x04';
            do {
              cVar13 = cVar7;
              if (uVar10 < 100) {
                cVar13 = cVar13 + -2;
                goto LAB_00103fcb;
              }
              if (uVar10 < 1000) {
                cVar13 = cVar13 + -1;
                goto LAB_00103fcb;
              }
              if (uVar10 < 10000) goto LAB_00103fcb;
              bVar17 = 99999 < uVar10;
              uVar10 = uVar10 / 10000;
              cVar7 = cVar13 + '\x04';
            } while (bVar17);
            cVar13 = cVar13 + '\x01';
          }
LAB_00103fcb:
          local_50 = &local_40;
          std::__cxx11::string::_M_construct((ulong)&local_50,cVar13);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_50->_M_local_buf,(uint)local_48,__val);
          std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_50);
          uVar14 = local_40._M_allocated_capacity;
          _Var15._M_p = (pointer)local_50;
          if (local_50 != &local_40) goto LAB_00104015;
        }
        else {
          convert_to_binary_abi_cxx11_(&local_70,(VcdGen *)(ulong)__val,uVar10,(uint32_t)paVar12);
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
          local_50 = &local_40;
          puVar9 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_40._M_allocated_capacity = *puVar9;
            local_40._8_8_ = puVar8[3];
          }
          else {
            local_40._M_allocated_capacity = *puVar9;
            local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar8;
          }
          local_48 = puVar8[1];
          *puVar8 = puVar9;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40._M_allocated_capacity + 1);
          }
          uVar14 = local_70.field_2._M_allocated_capacity;
          _Var15._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00104015:
            operator_delete(_Var15._M_p,uVar14 + 1);
          }
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar4 = (pSVar3->encoded_name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar4,pcVar4 + (pSVar3->encoded_name_)._M_string_length);
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
        local_50 = &local_40;
        paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 == paVar12) {
          local_40._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_40._8_8_ = puVar8[3];
        }
        else {
          local_40._M_allocated_capacity = paVar12->_M_allocated_capacity;
          local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar8;
        }
        local_48 = puVar8[1];
        *puVar8 = paVar12;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        auVar16 = (undefined1  [8])((long)auVar16 + 0x18);
      } while (auVar16 !=
               (undefined1  [8])
               data.
               super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,
                    (long)data.
                          super__Vector_base<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>,_std::allocator<std::tuple<unsigned_long,_unsigned_int,_const_VcdGen::Signal_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_b8);
  }
  return;
}

Assistant:

void generate_tick_data(){
        TickData &tick_data = get_tick_data();
        
        auto data = tick_data.get_data();

        sort(data.begin(), data.end());

        uint64_t tick_prev = -1;
        for( auto& d : data ) {

            #ifdef VCDGEN_DEBUG
                cout << "Time : " << get<0>(d) << "\t| Value : " << get<1>(d) << "\t| Name : " 
                     << get<2>(d)->get_name() << "\t| Symbol : " << get<2>(d)->get_encoded_name() 
                     << endl;
            #endif

            uint64_t tick  = get<0>(d); 
            uint32_t value = get<1>(d);
            const Signal* signal  = get<2>(d); 
            uint32_t width = signal->get_width();

            if( tick_prev != tick ){
                vcd_data_ += "#" + to_string(tick) + "\n";
            }
            if( width > 1 ){ 
                vcd_data_ += convert_to_binary(value, width) + " " ;
            } else {
                vcd_data_ += to_string(value);
            }
            vcd_data_ += signal->get_encoded_name() + "\n";
            tick_prev = tick;
        }
    }